

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O0

FEvent * __thiscall FEventTree::Predecessor(FEventTree *this,FEvent *event)

{
  bool bVar1;
  FEventTree *local_28;
  FEvent *y;
  FEvent *event_local;
  FEventTree *this_local;
  
  if ((FEventTree *)event->Left == this) {
    local_28 = (FEventTree *)event->Parent;
    y = event;
    while( true ) {
      bVar1 = false;
      if (local_28 != this) {
        bVar1 = y == (local_28->Nil).Left;
      }
      if (!bVar1) break;
      y = &local_28->Nil;
      local_28 = (FEventTree *)(local_28->Nil).Parent;
    }
    this_local = local_28;
  }
  else {
    for (y = event->Left; (FEventTree *)y->Right != this; y = y->Right) {
    }
    this_local = (FEventTree *)y;
  }
  return &this_local->Nil;
}

Assistant:

FEvent *FEventTree::Predecessor (FEvent *event) const
{
	if (event->Left != &Nil)
	{
		event = event->Left;
		while (event->Right != &Nil)
		{
			event = event->Right;
		}
		return event;
	}
	else
	{
		FEvent *y = event->Parent;
		while (y != &Nil && event == y->Left)
		{
			event = y;
			y = y->Parent;
		}
		return y;
	}
}